

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O2

bool kj::_::expectExit(Maybe<int> *statusCode,FunctionParam<void_()> code)

{
  __pid_t __pid;
  int iVar1;
  __pid_t _Var2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  anon_union_4_1_a8c68091_for_NullableValue<int>_2 *paVar6;
  bool bVar7;
  int status;
  Fault f;
  FunctionParam<void_()> code_local;
  
  do {
    __pid = fork();
    if (-1 < __pid) {
      if (__pid == 0) {
        (*(code *)*code.space._0_8_)();
        _exit(0);
      }
      goto LAB_00409303;
    }
    iVar1 = Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
LAB_00409303:
    do {
      _Var2 = waitpid(__pid,&status,0);
      if (-1 < _Var2) goto LAB_0040932c;
      iVar1 = Debug::getOsErrorNumber(false);
    } while (iVar1 == -1);
    if (iVar1 == 0) {
LAB_0040932c:
      uVar3 = status & 0x7f;
      if (uVar3 == 0) {
        uVar3 = (uint)status >> 8;
        uVar4 = uVar3 & 0xff;
        if ((statusCode->ptr).isSet == true) {
          paVar6 = &(statusCode->ptr).field_1;
          uVar5 = paVar6->value;
          f.exception = (Exception *)(CONCAT44(f.exception._4_4_,uVar3) & 0xffffffff000000ff);
          if ((uVar4 != uVar5) && (Debug::minSeverity < 3)) {
            Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int&>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                       ,0x95,ERROR,
                       "\"failed: expected \" \"WEXITSTATUS(status) == s\", _kjCondition",
                       (char (*) [42])"failed: expected WEXITSTATUS(status) == s",
                       (DebugComparison<int,_int_&> *)&f);
            uVar4 = (uint)status >> 8 & 0xff;
            uVar5 = paVar6->value;
          }
          bVar7 = uVar4 == uVar5;
        }
        else {
          f.exception = (Exception *)((ulong)uVar3 & 0xffffffff000000ff);
          if ((uVar4 == 0) && (Debug::minSeverity < 3)) {
            Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                       ,0x98,ERROR,
                       "\"failed: expected \" \"WEXITSTATUS(status) != 0\", _kjCondition",
                       (char (*) [42])"failed: expected WEXITSTATUS(status) != 0",
                       (DebugComparison<int,_int> *)&f);
          }
          bVar7 = (status & 0xff00U) != 0;
        }
      }
      else {
        if ((int)(uVar3 * 0x1000000 + 0x1000000) < 0x2000000) {
          if (Debug::minSeverity < 3) {
            Debug::log<char_const(&)[51],int&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                       ,0x9f,ERROR,
                       "\"subprocess didn\'t exit and didn\'t trigger a signal\", status",
                       (char (*) [51])"subprocess didn\'t exit and didn\'t trigger a signal",&status
                      );
          }
        }
        else if (Debug::minSeverity < 3) {
          f.exception = (Exception *)strsignal(uVar3);
          Debug::log<char_const(&)[46],char*>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                     ,0x9d,ERROR,
                     "\"subprocess didn\'t exit but triggered a signal\", strsignal(WTERMSIG(status))"
                     ,(char (*) [46])"subprocess didn\'t exit but triggered a signal",(char **)&f);
        }
        bVar7 = false;
      }
      return bVar7;
    }
    Debug::Fault::Fault(&f,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                        ,0x91,iVar1,"waitpid(child, &status, 0)","");
  }
  else {
    Debug::Fault::Fault(&f,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                        ,0x8a,iVar1,"child = fork()","");
  }
  Debug::Fault::fatal(&f);
}

Assistant:

bool expectExit(Maybe<int> statusCode, FunctionParam<void()> code)  noexcept {
#if _WIN32
  // We don't support death tests on Windows due to lack of efficient fork.
  return true;
#else
  pid_t child;
  KJ_SYSCALL(child = fork());
  if (child == 0) {
    code();
    _exit(0);
  }

  int status;
  KJ_SYSCALL(waitpid(child, &status, 0));

  if (WIFEXITED(status)) {
    KJ_IF_SOME(s, statusCode) {
      KJ_EXPECT(WEXITSTATUS(status) == s);
      return WEXITSTATUS(status) == s;
    } else {
      KJ_EXPECT(WEXITSTATUS(status) != 0);
      return WEXITSTATUS(status) != 0;
    }
  } else {
    if (WIFSIGNALED(status)) {
      KJ_FAIL_EXPECT("subprocess didn't exit but triggered a signal", strsignal(WTERMSIG(status)));
    } else {
      KJ_FAIL_EXPECT("subprocess didn't exit and didn't trigger a signal", status);
    }
    return false;
  }
#endif
}